

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O0

int __thiscall
icu_63::HebrewCalendar::clone
          (HebrewCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  HebrewCalendar *this_00;
  undefined8 local_30;
  HebrewCalendar *this_local;
  
  this_00 = (HebrewCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)__fn);
  local_30 = (HebrewCalendar *)0x0;
  if (this_00 != (HebrewCalendar *)0x0) {
    HebrewCalendar(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Calendar* HebrewCalendar::clone() const {
    return new HebrewCalendar(*this);
}